

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

void VW::clear_seq_and_finish_examples(vw *all,multi_ex *ec_seq)

{
  pointer ppeVar1;
  iterator __begin2;
  pointer ppeVar2;
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppeVar1 != ppeVar2; ppeVar2 = ppeVar2 + 1) {
    if ((*ppeVar2)->in_use == true) {
      finish_example(all,*ppeVar2);
    }
  }
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppeVar2;
  }
  return;
}

Assistant:

void clear_seq_and_finish_examples(vw& all, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
    for (example* ecc : ec_seq)
      if (ecc->in_use)
        VW::finish_example(all, *ecc);
  ec_seq.clear();
}